

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

QPDF_ERROR_CODE qpdf_init_write_memory(qpdf_data qpdf)

{
  QPDF_ERROR_CODE QVar1;
  code *local_30 [2];
  code *local_20;
  code *local_18;
  
  qpdf_init_write_internal(qpdf);
  local_30[1] = (code *)0x0;
  local_30[0] = call_init_write_memory;
  local_18 = std::_Function_handler<void_(_qpdf_data_*),_void_(*)(_qpdf_data_*)>::_M_invoke;
  local_20 = std::_Function_handler<void_(_qpdf_data_*),_void_(*)(_qpdf_data_*)>::_M_manager;
  QVar1 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)local_30);
  std::_Function_base::~_Function_base((_Function_base *)local_30);
  qpdf->write_memory = true;
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_init_write_memory(qpdf_data qpdf)
{
    qpdf_init_write_internal(qpdf);
    QPDF_ERROR_CODE status = trap_errors(qpdf, &call_init_write_memory);
    QTC::TC("qpdf", "qpdf-c called qpdf_init_write_memory");
    qpdf->write_memory = true;
    return status;
}